

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O0

int ASN1_STRING_copy(ASN1_STRING *dst,ASN1_STRING *str)

{
  int iVar1;
  ASN1_STRING *str_local;
  ASN1_STRING *dst_local;
  
  if (str == (ASN1_STRING *)0x0) {
    dst_local._4_4_ = 0;
  }
  else {
    iVar1 = ASN1_STRING_set((ASN1_STRING *)dst,str->data,(long)str->length);
    if (iVar1 == 0) {
      dst_local._4_4_ = 0;
    }
    else {
      dst->type = str->type;
      dst->flags = str->flags;
      dst_local._4_4_ = 1;
    }
  }
  return dst_local._4_4_;
}

Assistant:

int ASN1_STRING_copy(ASN1_STRING *dst, const ASN1_STRING *str) {
  if (str == NULL) {
    return 0;
  }
  if (!ASN1_STRING_set(dst, str->data, str->length)) {
    return 0;
  }
  dst->type = str->type;
  dst->flags = str->flags;
  return 1;
}